

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwrEva.c
# Opt level: O2

int Rwr_NodeRewrite(Rwr_Man_t *p,Cut_Man_t *pManCut,Abc_Obj_t *pNode,int fUpdateLevel,int fUseZeros,
                   int fPlaceEnable)

{
  char cVar1;
  ushort uVar2;
  char *pcVar3;
  Vec_Ptr_t *pVVar4;
  Abc_Ntk_t *pAVar5;
  Dec_Graph_t *pGraph;
  abctime aVar6;
  uint *puVar7;
  abctime aVar8;
  ulong uVar9;
  void *pvVar10;
  int *piVar11;
  abctime aVar12;
  Vec_Ptr_t *p_00;
  void *pvVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  int i;
  uint uVar19;
  long lVar20;
  int local_88;
  int local_84;
  int local_80;
  uint local_7c;
  int local_78;
  Dec_Graph_t *local_70;
  
  p->nNodesConsidered = p->nNodesConsidered + 1;
  if (fUpdateLevel == 0) {
    local_78 = 1000000000;
  }
  else {
    local_78 = Abc_ObjRequiredLevel(pNode);
  }
  aVar6 = Abc_Clock();
  puVar7 = (uint *)Abc_NodeGetCutsRecursive(pManCut,pNode,0,0);
  if (puVar7 == (uint *)0x0) {
    __assert_fail("pCut != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/rwr/rwrEva.c"
                  ,0x51,"int Rwr_NodeRewrite(Rwr_Man_t *, Cut_Man_t *, Abc_Obj_t *, int, int, int)")
    ;
  }
  aVar8 = Abc_Clock();
  p->timeCut = p->timeCut + (aVar8 - aVar6);
  aVar6 = Abc_Clock();
  local_7c = 0;
  local_84 = -1;
  local_80 = local_84;
  do {
    do {
      puVar7 = *(uint **)(puVar7 + 4);
      if (puVar7 == (uint *)0x0) {
        aVar8 = Abc_Clock();
        p->timeRes = p->timeRes + (aVar8 - aVar6);
        if (local_80 != -1) {
          lVar20 = 8;
          for (lVar18 = 0; lVar18 < p->vFanins->nSize; lVar18 = lVar18 + 1) {
            pvVar10 = Vec_PtrEntry(p->vFanins,(int)lVar18);
            *(void **)(*(long *)((long)p->pGraph + 0x10) + lVar20) = pvVar10;
            lVar20 = lVar20 + 0x18;
          }
          p->nScores[p->pMap[local_7c]] = p->nScores[p->pMap[local_7c]] + 1;
          p->nNodesGained = p->nNodesGained + local_80;
          if ((fUseZeros != 0) || (0 < local_80)) {
            p->nNodesRewritten = p->nNodesRewritten + 1;
          }
        }
        return local_80;
      }
    } while (*puVar7 < 0x40000000);
    uVar2 = *(ushort *)((long)puVar7 + (ulong)(*puVar7 >> 0x16 & 0x3c) + 0x18);
    pcVar3 = p->pPerms4[p->pPerms[uVar2]];
    cVar1 = p->pPhases[uVar2];
    pVVar4 = p->vFaninsCur;
    pVVar4->nSize = 0;
    uVar19 = *puVar7 >> 0x1c;
    Vec_PtrGrow(pVVar4,uVar19);
    for (uVar9 = 0; uVar19 != uVar9; uVar9 = uVar9 + 1) {
      pVVar4->pArray[uVar9] = (void *)0x0;
    }
    pVVar4->nSize = uVar19;
    uVar9 = 0;
    while( true ) {
      uVar19 = *puVar7 >> 0x1c;
      if (uVar19 <= uVar9) break;
      pvVar10 = Vec_PtrEntry(pNode->pNtk->vObjs,puVar7[(long)pcVar3[uVar9] + 6]);
      if (pvVar10 == (void *)0x0) {
        uVar19 = *puVar7 >> 0x1c;
        break;
      }
      if ((long)p->vFaninsCur->nSize <= (long)uVar9) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
      }
      p->vFaninsCur->pArray[uVar9] =
           (void *)((ulong)pvVar10 ^ (ulong)(((uint)(int)cVar1 >> ((uint)uVar9 & 0x1f) & 1) != 0));
      uVar9 = uVar9 + 1;
    }
    if (uVar19 == (uint)uVar9) {
      p->nCutsGood = p->nCutsGood + 1;
      uVar19 = 0;
      for (iVar15 = 0; iVar15 < p->vFaninsCur->nSize; iVar15 = iVar15 + 1) {
        pvVar10 = Vec_PtrEntry(p->vFaninsCur,iVar15);
        uVar19 = uVar19 + (*(int *)(((ulong)pvVar10 & 0xfffffffffffffffe) + 0x2c) == 1);
      }
      if (uVar19 < 3) {
        aVar8 = Abc_Clock();
        for (iVar15 = 0; iVar15 < p->vFaninsCur->nSize; iVar15 = iVar15 + 1) {
          pvVar10 = Vec_PtrEntry(p->vFaninsCur,iVar15);
          piVar11 = (int *)(((ulong)pvVar10 & 0xfffffffffffffffe) + 0x2c);
          *piVar11 = *piVar11 + 1;
        }
        pAVar5 = pNode->pNtk;
        if ((pAVar5->vTravIds).pArray == (int *)0x0) {
          uVar9 = (long)pAVar5->vObjs->nSize + 500;
          iVar15 = (int)uVar9;
          if ((pAVar5->vTravIds).nCap < iVar15) {
            piVar11 = (int *)malloc(uVar9 * 4);
            (pAVar5->vTravIds).pArray = piVar11;
            if (piVar11 == (int *)0x0) {
              __assert_fail("p->pArray",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                            ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
            }
            (pAVar5->vTravIds).nCap = iVar15;
          }
          else {
            piVar11 = (int *)0x0;
          }
          uVar14 = 0;
          if (0 < iVar15) {
            uVar14 = uVar9 & 0xffffffff;
          }
          for (uVar9 = 0; uVar14 != uVar9; uVar9 = uVar9 + 1) {
            piVar11[uVar9] = 0;
          }
          (pAVar5->vTravIds).nSize = iVar15;
        }
        iVar15 = pAVar5->nTravIds;
        pAVar5->nTravIds = iVar15 + 1;
        if (0x3ffffffe < iVar15) {
          __assert_fail("p->nTravIds < (1<<30)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                        ,0x197,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
        }
        iVar15 = Abc_NodeMffcLabelAig(pNode);
        for (iVar16 = 0; iVar16 < p->vFaninsCur->nSize; iVar16 = iVar16 + 1) {
          pvVar10 = Vec_PtrEntry(p->vFaninsCur,iVar16);
          piVar11 = (int *)(((ulong)pvVar10 & 0xfffffffffffffffe) + 0x2c);
          *piVar11 = *piVar11 + -1;
        }
        aVar12 = Abc_Clock();
        p->timeMffc = p->timeMffc + (aVar12 - aVar8);
        aVar8 = Abc_Clock();
        pVVar4 = p->vFaninsCur;
        p_00 = Vec_VecEntry(p->vClasses,
                            (uint)p->pMap[(ushort)puVar7[(ulong)(*(byte *)((long)puVar7 + 3) & 0xf)
                                                         + 6]]);
        iVar16 = p_00->nSize;
        p->nSubgraphs = p->nSubgraphs + iVar16;
        local_88 = -1;
        local_70 = (Dec_Graph_t *)0x0;
        for (i = 0; i < iVar16; i = i + 1) {
          pvVar10 = Vec_PtrEntry(p_00,i);
          pGraph = *(Dec_Graph_t **)((long)pvVar10 + 0x28);
          lVar20 = 8;
          for (lVar18 = 0; lVar18 < pVVar4->nSize; lVar18 = lVar18 + 1) {
            pvVar13 = Vec_PtrEntry(pVVar4,(int)lVar18);
            *(void **)(&(pGraph->pNodes->eEdge0).field_0x0 + lVar20) = pvVar13;
            lVar20 = lVar20 + 0x18;
          }
          iVar16 = Dec_GraphToNetworkCount(pNode,pGraph,iVar15,local_78);
          if (iVar16 != -1) {
            iVar17 = iVar15 - iVar16;
            if (iVar15 < iVar16) {
              __assert_fail("nNodesSaved >= nNodesAdded",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/rwr/rwrEva.c"
                            ,0x119,
                            "Dec_Graph_t *Rwr_CutEvaluate(Rwr_Man_t *, Abc_Obj_t *, Cut_Cut_t *, Vec_Ptr_t *, int, int, int *, int)"
                           );
            }
            if (local_88 < iVar17) {
              local_70 = pGraph;
              if (iVar17 < 1) {
                local_88 = 0;
              }
              else {
                *(uint *)((long)pvVar10 + 8) =
                     CONCAT22((short)iVar17 +
                              (short)((ulong)*(undefined8 *)((long)pvVar10 + 8) >> 0x10),
                              (short)*(undefined8 *)((long)pvVar10 + 8) + 1);
                *(short *)((long)pvVar10 + 0xc) = *(short *)((long)pvVar10 + 0xc) + (short)iVar16;
                local_88 = iVar17;
              }
            }
          }
          iVar16 = p_00->nSize;
        }
        iVar15 = local_88;
        if (local_88 == -1) {
          local_70 = (Dec_Graph_t *)0x0;
          iVar15 = local_84;
        }
        local_84 = iVar15;
        aVar12 = Abc_Clock();
        p->timeEval = p->timeEval + (aVar12 - aVar8);
        if (local_80 < local_84 && local_70 != (Dec_Graph_t *)0x0) {
          p->pGraph = local_70;
          p->fCompl = (uint)(int)cVar1 >> 4 & 1;
          local_7c = (uint)(ushort)puVar7[(ulong)(*(byte *)((long)puVar7 + 3) & 0xf) + 6];
          p->vFanins->nSize = 0;
          for (iVar15 = 0; local_80 = local_84, iVar15 < p->vFaninsCur->nSize; iVar15 = iVar15 + 1)
          {
            pvVar10 = Vec_PtrEntry(p->vFaninsCur,iVar15);
            Vec_PtrPush(p->vFanins,pvVar10);
          }
        }
      }
    }
    else {
      p->nCutsBad = p->nCutsBad + 1;
    }
  } while( true );
}

Assistant:

int Rwr_NodeRewrite( Rwr_Man_t * p, Cut_Man_t * pManCut, Abc_Obj_t * pNode, int fUpdateLevel, int fUseZeros, int fPlaceEnable )
{
    int fVeryVerbose = 0;
    Dec_Graph_t * pGraph;
    Cut_Cut_t * pCut;//, * pTemp;
    Abc_Obj_t * pFanin;
    unsigned uPhase;
    unsigned uTruthBest = 0; // Suppress "might be used uninitialized"
    unsigned uTruth;
    char * pPerm;
    int Required, nNodesSaved;
    int nNodesSaveCur = -1; // Suppress "might be used uninitialized"
    int i, GainCur = -1, GainBest = -1;
    abctime clk, clk2;//, Counter;

    p->nNodesConsidered++;
    // get the required times
    Required = fUpdateLevel? Abc_ObjRequiredLevel(pNode) : ABC_INFINITY;

    // get the node's cuts
clk = Abc_Clock();
    pCut = (Cut_Cut_t *)Abc_NodeGetCutsRecursive( pManCut, pNode, 0, 0 );
    assert( pCut != NULL );
p->timeCut += Abc_Clock() - clk;

//printf( " %d", Rwr_CutCountNumNodes(pNode, pCut) );
/*
    Counter = 0;
    for ( pTemp = pCut->pNext; pTemp; pTemp = pTemp->pNext )
        Counter++;
    printf( "%d ", Counter );
*/
    // go through the cuts
clk = Abc_Clock();
    for ( pCut = pCut->pNext; pCut; pCut = pCut->pNext )
    {
        // consider only 4-input cuts
        if ( pCut->nLeaves < 4 )
            continue;
//            Cut_CutPrint( pCut, 0 ), printf( "\n" );

        // get the fanin permutation
        uTruth = 0xFFFF & *Cut_CutReadTruth(pCut);
        pPerm = p->pPerms4[ (int)p->pPerms[uTruth] ];
        uPhase = p->pPhases[uTruth];
        // collect fanins with the corresponding permutation/phase
        Vec_PtrClear( p->vFaninsCur );
        Vec_PtrFill( p->vFaninsCur, (int)pCut->nLeaves, 0 );
        for ( i = 0; i < (int)pCut->nLeaves; i++ )
        {
            pFanin = Abc_NtkObj( pNode->pNtk, pCut->pLeaves[(int)pPerm[i]] );
            if ( pFanin == NULL )
                break;
            pFanin = Abc_ObjNotCond(pFanin, ((uPhase & (1<<i)) > 0) );
            Vec_PtrWriteEntry( p->vFaninsCur, i, pFanin );
        }
        if ( i != (int)pCut->nLeaves )
        {
            p->nCutsBad++;
            continue;
        }
        p->nCutsGood++;

        {
            int Counter = 0;
            Vec_PtrForEachEntry( Abc_Obj_t *, p->vFaninsCur, pFanin, i )
                if ( Abc_ObjFanoutNum(Abc_ObjRegular(pFanin)) == 1 )
                    Counter++;
            if ( Counter > 2 )
                continue;
        }

clk2 = Abc_Clock();
/*
        printf( "Considering: (" );
        Vec_PtrForEachEntry( Abc_Obj_t *, p->vFaninsCur, pFanin, i )
            printf( "%d ", Abc_ObjFanoutNum(Abc_ObjRegular(pFanin)) );
        printf( ")\n" );
*/
        // mark the fanin boundary 
        Vec_PtrForEachEntry( Abc_Obj_t *, p->vFaninsCur, pFanin, i )
            Abc_ObjRegular(pFanin)->vFanouts.nSize++;

        // label MFFC with current ID
        Abc_NtkIncrementTravId( pNode->pNtk );
        nNodesSaved = Abc_NodeMffcLabelAig( pNode );
        // unmark the fanin boundary
        Vec_PtrForEachEntry( Abc_Obj_t *, p->vFaninsCur, pFanin, i )
            Abc_ObjRegular(pFanin)->vFanouts.nSize--;
p->timeMffc += Abc_Clock() - clk2;

        // evaluate the cut
clk2 = Abc_Clock();
        pGraph = Rwr_CutEvaluate( p, pNode, pCut, p->vFaninsCur, nNodesSaved, Required, &GainCur, fPlaceEnable );
p->timeEval += Abc_Clock() - clk2;

        // check if the cut is better than the current best one
        if ( pGraph != NULL && GainBest < GainCur )
        {
            // save this form
            nNodesSaveCur = nNodesSaved;
            GainBest  = GainCur;
            p->pGraph  = pGraph;
            p->fCompl = ((uPhase & (1<<4)) > 0);
            uTruthBest = 0xFFFF & *Cut_CutReadTruth(pCut);
            // collect fanins in the
            Vec_PtrClear( p->vFanins );
            Vec_PtrForEachEntry( Abc_Obj_t *, p->vFaninsCur, pFanin, i )
                Vec_PtrPush( p->vFanins, pFanin );
        }
    }
p->timeRes += Abc_Clock() - clk;

    if ( GainBest == -1 )
        return -1;
/*
    if ( GainBest > 0 )
    {
        printf( "Class %d  ", p->pMap[uTruthBest] );
        printf( "Gain = %d. Node %d : ", GainBest, pNode->Id );
        Vec_PtrForEachEntry( Abc_Obj_t *, p->vFanins, pFanin, i )
            printf( "%d ", Abc_ObjRegular(pFanin)->Id );
        Dec_GraphPrint( stdout, p->pGraph, NULL, NULL );
        printf( "\n" );
    }
*/

//    printf( "%d", nNodesSaveCur - GainBest );
/*
    if ( GainBest > 0 )
    {
        if ( Rwr_CutIsBoolean( pNode, p->vFanins ) )
            printf( "b" );
        else
        {
            printf( "Node %d : ", pNode->Id );
            Vec_PtrForEachEntry( Abc_Obj_t *, p->vFanins, pFanin, i )
                printf( "%d ", Abc_ObjRegular(pFanin)->Id );
            printf( "a" );
        }
    }
*/
/*
    if ( GainBest > 0 )
        if ( p->fCompl )
            printf( "c" );
        else
            printf( "." );
*/

    // copy the leaves
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vFanins, pFanin, i )
        Dec_GraphNode((Dec_Graph_t *)p->pGraph, i)->pFunc = pFanin;
/*
    printf( "(" );
    Vec_PtrForEachEntry( Abc_Obj_t *, p->vFanins, pFanin, i )
        printf( " %d", Abc_ObjRegular(pFanin)->vFanouts.nSize - 1 );
    printf( " )  " );
*/
//    printf( "%d ", Rwr_NodeGetDepth_rec( pNode, p->vFanins ) );

    p->nScores[p->pMap[uTruthBest]]++;
    p->nNodesGained += GainBest;
    if ( fUseZeros || GainBest > 0 )
    {
        p->nNodesRewritten++;
    }

    // report the progress
    if ( fVeryVerbose && GainBest > 0 )
    {
        printf( "Node %6s :   ", Abc_ObjName(pNode) );
        printf( "Fanins = %d. ", p->vFanins->nSize );
        printf( "Save = %d.  ", nNodesSaveCur );
        printf( "Add = %d.  ",  nNodesSaveCur-GainBest );
        printf( "GAIN = %d.  ", GainBest );
        printf( "Cone = %d.  ", p->pGraph? Dec_GraphNodeNum((Dec_Graph_t *)p->pGraph) : 0 );
        printf( "Class = %d.  ", p->pMap[uTruthBest] );
        printf( "\n" );
    }
    return GainBest;
}